

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::setZValue(QGraphicsItem *this,qreal z)

{
  qreal *pqVar1;
  undefined1 *puVar2;
  uint *puVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsScene *pQVar5;
  long lVar6;
  long *plVar7;
  long in_FS_OFFSET;
  qreal newZ;
  QVariant local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 uStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_68,z);
  (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0x17,&local_68);
  ::QVariant::~QVariant((QVariant *)&local_68);
  newZ = (qreal)::QVariant::toReal((bool *)local_48.data);
  pQVar4 = (this->d_ptr).d;
  pqVar1 = &pQVar4->z;
  if ((newZ != *pqVar1) || (NAN(newZ) || NAN(*pqVar1))) {
    pQVar5 = pQVar4->scene;
    if ((pQVar5 != (QGraphicsScene *)0x0) &&
       (lVar6 = *(long *)&pQVar5->field_0x8, *(int *)(lVar6 + 0x84) != -1)) {
      plVar7 = *(long **)(lVar6 + 0x88);
      (**(code **)(*plVar7 + 200))(plVar7,this,0x17,&newZ);
    }
    pQVar4 = (this->d_ptr).d;
    pQVar4->z = newZ;
    if (pQVar4->parent == (QGraphicsItem *)0x0) {
      if (pQVar4->scene != (QGraphicsScene *)0x0) {
        puVar3 = (uint *)(*(long *)&pQVar4->scene->field_0x8 + 0xb8);
        *puVar3 = *puVar3 | 0x20;
      }
    }
    else {
      puVar2 = &((pQVar4->parent->d_ptr).d)->field_0x160;
      *(ulong *)puVar2 = *(ulong *)puVar2 | 0x20000000;
    }
    pQVar5 = ((this->d_ptr).d)->scene;
    if (pQVar5 != (QGraphicsScene *)0x0) {
      local_68._16_8_ = 0;
      uStack_50 = 0;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      QGraphicsScenePrivate::markDirty
                (*(QGraphicsScenePrivate **)&pQVar5->field_0x8,this,(QRectF *)&local_68,true,false,
                 false,false,false);
    }
    (*this->_vptr_QGraphicsItem[0x21])(&local_88,this,0x18);
    ::QVariant::~QVariant(&local_88);
    if ((((this->d_ptr).d)->field_0x165 & 0x20) != 0) {
      setFlag(this,ItemStacksBehindParent,z < 0.0);
    }
    if ((((this->d_ptr).d)->field_0x167 & 1) != 0) {
      QMetaObject::activate
                ((QObject *)(this + -1),&QGraphicsObject::staticMetaObject,6,(void **)0x0);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setZValue(qreal z)
{
    const QVariant newZVariant(itemChange(ItemZValueChange, z));
    qreal newZ = newZVariant.toReal();
    if (newZ == d_ptr->z)
        return;

    if (d_ptr->scene && d_ptr->scene->d_func()->indexMethod != QGraphicsScene::NoIndex) {
        // Z Value has changed, we have to notify the index.
        d_ptr->scene->d_func()->index->itemChange(this, ItemZValueChange, &newZ);
    }

    d_ptr->z = newZ;
    if (d_ptr->parent)
        d_ptr->parent->d_ptr->needSortChildren = 1;
    else if (d_ptr->scene)
        d_ptr->scene->d_func()->needSortTopLevelItems = 1;

    if (d_ptr->scene)
        d_ptr->scene->d_func()->markDirty(this, QRectF(), /*invalidateChildren=*/true);

    itemChange(ItemZValueHasChanged, newZVariant);

    if (d_ptr->flags & ItemNegativeZStacksBehindParent)
        setFlag(QGraphicsItem::ItemStacksBehindParent, z < qreal(0.0));

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->zChanged();
}